

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O1

vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
* __thiscall
webfront::http::Response::toBuffers<webfront::networking::TCPNetworkingTS>
          (vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
           *__return_storage_ptr__,Response *this)

{
  pointer *ppcVar1;
  StatusCode SVar2;
  iterator iVar3;
  pointer pHVar4;
  size_type sVar5;
  Response *pRVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  Header *header;
  pointer pHVar11;
  uint __len;
  vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  *__range3;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Response *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_ == '\0') {
    toBuffers<webfront::networking::TCPNetworkingTS>();
  }
  SVar2 = this->statusCode;
  __len = 1;
  if (((9 < SVar2) && (__len = 2, 99 < SVar2)) && (__len = 3, 999 < SVar2)) {
    __len = 5 - (SVar2 < 10000);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)__len,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50._M_dataplus._M_p,__len,(uint)SVar2);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_50,0,0,"HTTP/1.1 ",9);
  local_70._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar8) {
    local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70," ");
  paVar8 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar9) {
    local_b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  toString_abi_cxx11_(&local_90,(Response *)(ulong)this->statusCode,
                      (StatusCode)local_b0._M_string_length);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar8) {
    uVar10 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_90._M_string_length + local_b0._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar10 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_b0._M_string_length <= (ulong)uVar10) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_90,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      goto LAB_00116320;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0,local_90._M_dataplus._M_p,local_90._M_string_length);
LAB_00116320:
  local_d0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar9) {
    local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_d0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
  local_d8 = this;
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d0,"\r\n");
  local_f8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == paVar9) {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_f8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  pRVar6 = local_d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar8) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  sVar5 = toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_string_length
  ;
  local_f8._M_dataplus._M_p =
       (pointer)toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_.
                _M_string_length;
  if (toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_string_length !=
      0) {
    local_f8._M_dataplus._M_p =
         toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_dataplus._M_p;
  }
  local_f8._M_string_length =
       toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_string_length;
  iVar3._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::_M_realloc_insert<std::experimental::net::v1::const_buffer>
              (__return_storage_ptr__,iVar3,(const_buffer *)&local_f8);
  }
  else {
    (iVar3._M_current)->data_ = local_f8._M_dataplus._M_p;
    (iVar3._M_current)->size_ = sVar5;
    ppcVar1 = &(__return_storage_ptr__->
               super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  pHVar4 = (pRVar6->super_Headers).headers.
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pHVar11 = (pRVar6->super_Headers).headers.
                 super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                 ._M_impl.super__Vector_impl_data._M_start; pHVar11 != pHVar4; pHVar11 = pHVar11 + 1
      ) {
    local_f8._M_string_length = (pHVar11->name)._M_string_length;
    local_f8._M_dataplus._M_p = (pointer)local_f8._M_string_length;
    if ((pointer)local_f8._M_string_length != (pointer)0x0) {
      local_f8._M_dataplus._M_p = (pHVar11->name)._M_dataplus._M_p;
    }
    iVar3._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      ::_M_realloc_insert<std::experimental::net::v1::const_buffer>
                (__return_storage_ptr__,iVar3,(const_buffer *)&local_f8);
    }
    else {
      (iVar3._M_current)->data_ = local_f8._M_dataplus._M_p;
      (iVar3._M_current)->size_ = local_f8._M_string_length;
      ppcVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_f8._M_dataplus._M_p = ": ";
    local_f8._M_string_length = 2;
    iVar3._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      ::_M_realloc_insert<std::experimental::net::v1::const_buffer>
                (__return_storage_ptr__,iVar3,(const_buffer *)&local_f8);
    }
    else {
      (iVar3._M_current)->data_ = ": ";
      (iVar3._M_current)->size_ = 2;
      ppcVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_f8._M_string_length = (pHVar11->value)._M_string_length;
    local_f8._M_dataplus._M_p = (pointer)local_f8._M_string_length;
    if ((pointer)local_f8._M_string_length != (pointer)0x0) {
      local_f8._M_dataplus._M_p = (pHVar11->value)._M_dataplus._M_p;
    }
    iVar3._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      ::_M_realloc_insert<std::experimental::net::v1::const_buffer>
                (__return_storage_ptr__,iVar3,(const_buffer *)&local_f8);
    }
    else {
      (iVar3._M_current)->data_ = local_f8._M_dataplus._M_p;
      (iVar3._M_current)->size_ = local_f8._M_string_length;
      ppcVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_f8._M_dataplus._M_p = "\r\n";
    local_f8._M_string_length = 2;
    iVar3._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      ::_M_realloc_insert<std::experimental::net::v1::const_buffer>
                (__return_storage_ptr__,iVar3,(const_buffer *)&local_f8);
    }
    else {
      (iVar3._M_current)->data_ = "\r\n";
      (iVar3._M_current)->size_ = 2;
      ppcVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  local_f8._M_dataplus._M_p = "\r\n";
  local_f8._M_string_length = 2;
  iVar3._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::_M_realloc_insert<std::experimental::net::v1::const_buffer>
              (__return_storage_ptr__,iVar3,(const_buffer *)&local_f8);
  }
  else {
    (iVar3._M_current)->data_ = "\r\n";
    (iVar3._M_current)->size_ = 2;
    ppcVar1 = &(__return_storage_ptr__->
               super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  local_f8._M_string_length = (local_d8->content)._M_string_length;
  if (local_f8._M_string_length != 0) {
    local_f8._M_dataplus._M_p = (local_d8->content)._M_dataplus._M_p;
    iVar3._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      ::_M_realloc_insert<std::experimental::net::v1::const_buffer>
                (__return_storage_ptr__,iVar3,(const_buffer *)&local_f8);
    }
    else {
      (iVar3._M_current)->data_ = local_f8._M_dataplus._M_p;
      (iVar3._M_current)->size_ = local_f8._M_string_length;
      ppcVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<typename Net::ConstBuffer> toBuffers() const {
        std::vector<typename Net::ConstBuffer> buffers;
        static std::string httpStatus;
        httpStatus = "HTTP/1.1 " + std::to_string(statusCode) + " " + toString(statusCode) + "\r\n";
        buffers.push_back(Net::Buffer(httpStatus));

        static const char separator[] = {':', ' '};
        static const char crlf[] = {'\r', '\n'};
        for (auto& header : headers) {
            buffers.push_back(Net::Buffer(header.name));
            buffers.push_back(Net::Buffer(separator));
            buffers.push_back(Net::Buffer(header.value));
            buffers.push_back(Net::Buffer(crlf));
        }
        buffers.push_back(Net::Buffer(crlf));
        if (!content.empty()) buffers.push_back(Net::Buffer(content));

        return buffers;
    }